

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O2

void henson::Serialization<henson::Array>::load(BinaryBuffer *bb,Array *x)

{
  element_type *peVar1;
  pointer pcVar2;
  void **result;
  __shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2> local_38;
  size_t index;
  
  (*bb->_vptr_BinaryBuffer[1])(bb,&index,8);
  (*bb->_vptr_BinaryBuffer[1])(bb,&x->type,8);
  (*bb->_vptr_BinaryBuffer[1])(bb,&x->count,8);
  std::make_shared<std::vector<char,std::allocator<char>>,unsigned_long>((unsigned_long *)&local_38)
  ;
  std::__shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(x->storage).
              super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  peVar1 = (x->storage).
           super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar2 = (peVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  (*bb->_vptr_BinaryBuffer[1])
            (bb,pcVar2,
             (long)(peVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pcVar2);
  if (index < 5) {
    pcVar2 = (((x->storage).
               super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    switch(index) {
    case 0:
      if ((x->address).impl_.
          super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ != 0
         ) {
        (x->address).impl_.
        super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ = 0;
      }
      break;
    case 1:
      if ((x->address).impl_.
          super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ != 1
         ) {
        (x->address).impl_.
        super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ = 1;
      }
      break;
    case 2:
      if ((x->address).impl_.
          super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ != 2
         ) {
        (x->address).impl_.
        super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ = 2;
      }
      break;
    case 3:
      if ((x->address).impl_.
          super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ != 3
         ) {
        (x->address).impl_.
        super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ = 3;
      }
      break;
    case 4:
      if ((x->address).impl_.
          super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ != 4
         ) {
        (x->address).impl_.
        super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ = 4;
      }
    }
    *(pointer *)
     &(x->address).impl_.
      super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
      .
      super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
      .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
      super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
      .
      super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
         = pcVar2;
  }
  x->stride = x->type;
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Array& x)
  {
    size_t index;
    henson::load(bb, index);
    henson::load(bb, x.type);
    henson::load(bb, x.count);
    x.storage = std::make_shared<std::vector<char>>(x.count*x.type);
    henson::load(bb, x.storage->data(), x.storage->size());

    void* data = x.storage->data();
    if (index == 0)
        x.address = static_cast<variant_alternative_t<0, Array::Address>>(data);
    else if (index == 1)
        x.address = static_cast<variant_alternative_t<1, Array::Address>>(data);
    else if (index == 2)
        x.address = static_cast<variant_alternative_t<2, Array::Address>>(data);
    else if (index == 3)
        x.address = static_cast<variant_alternative_t<3, Array::Address>>(data);
    else if (index == 4)
        x.address = static_cast<variant_alternative_t<4, Array::Address>>(data);

    x.stride = x.type;
  }